

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall glcts::BasicUsageNoOffset::Run(BasicUsageNoOffset *this)

{
  CallLogWrapper *this_00;
  uint uVar1;
  bool bVar2;
  GLuint GVar3;
  undefined8 *puVar4;
  void *pvVar5;
  long lVar6;
  int i;
  ulong uVar7;
  allocator<char> local_51;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "\nlayout(local_size_x = 8, local_size_y = 8, local_size_z = 1) in;\nlayout(binding = 0) uniform atomic_uint ac_counter_inc;\nlayout(binding = 0) uniform atomic_uint ac_counter_dec;\nlayout(std430) buffer Output {\n  mediump uint data_inc[256];\n  mediump uint data_dec[256];\n} g_out;\nvoid main() {\n  mediump uint offset = 32u * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n  g_out.data_inc[offset] = atomicCounterIncrement(ac_counter_inc);\n  g_out.data_dec[offset] = atomicCounterDecrement(ac_counter_dec);\n}"
             ,&local_51);
  GVar3 = BasicUsageCS::CreateComputeProgram(&this->super_BasicUsageCS,&local_50);
  this->prog_ = GVar3;
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = &(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->prog_);
  bVar2 = BasicUsageCS::CheckProgram(&this->super_BasicUsageCS,this->prog_,(bool *)0x0);
  if (bVar2) {
    glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)&(this->super_BasicUsageCS).field_0x34);
    glu::CallLogWrapper::glBindBufferBase
              (this_00,0x92c0,0,*(GLuint *)&(this->super_BasicUsageCS).field_0x34);
    glu::CallLogWrapper::glBufferData(this_00,0x92c0,8,(void *)0x0,0x88ea);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    glu::CallLogWrapper::glBindBuffer
              (this_00,0x92c0,*(GLuint *)&(this->super_BasicUsageCS).field_0x34);
    puVar4 = (undefined8 *)glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,8,10);
    *puVar4 = 0x10000000000;
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x800,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    glu::CallLogWrapper::glUseProgram(this_00,this->prog_);
    glu::CallLogWrapper::glDispatchCompute(this_00,4,1,1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_buffer);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    pvVar5 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x800,3);
    std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>(pvVar5,(long)pvVar5 + 0x800);
    lVar6 = 0;
    for (uVar7 = 0; uVar7 < 0x200; uVar7 = uVar7 + 2) {
      if (*(int *)((long)pvVar5 + uVar7 * 4) != *(int *)((long)pvVar5 + uVar7 * 4 + 4)) {
        glcts::anon_unknown_0::Output("Pair of values should be equal, got: %d, %d\n");
        lVar6 = -1;
      }
      if ((uVar7 < 0x1fe) &&
         (uVar1 = *(uint *)((long)pvVar5 + uVar7 * 4),
         uVar1 == *(uint *)((long)pvVar5 + uVar7 * 4 + 8))) {
        glcts::anon_unknown_0::Output
                  ("Too many same values found: %d, index: %d\n",(ulong)uVar1,uVar7 & 0xffffffff);
        lVar6 = -1;
      }
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  }
  else {
    lVar6 = -1;
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		// create program
		const char* const glsl_cs =
			NL "layout(local_size_x = 8, local_size_y = 8, local_size_z = 1) in;" NL
			   "layout(binding = 0) uniform atomic_uint ac_counter_inc;" NL
			   "layout(binding = 0) uniform atomic_uint ac_counter_dec;" NL "layout(std430) buffer Output {" NL
			   "  mediump uint data_inc[256];" NL "  mediump uint data_dec[256];" NL "} g_out;" NL "void main() {" NL
			   "  mediump uint offset = 32u * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;" NL
			   "  g_out.data_inc[offset] = atomicCounterIncrement(ac_counter_inc);" NL
			   "  g_out.data_dec[offset] = atomicCounterDecrement(ac_counter_dec);" NL "}";
		prog_ = CreateComputeProgram(glsl_cs);
		glLinkProgram(prog_);
		if (!CheckProgram(prog_))
			return ERROR;

		// create atomic counter buffer
		glGenBuffers(1, &counter_buffer_);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 8, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		unsigned int* ptr = static_cast<unsigned int*>(
			glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 8, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT));
		*ptr++ = 0;
		*ptr++ = 256;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 512 * sizeof(GLuint), NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(prog_);
		glDispatchCompute(4, 1, 1);

		long	error = NO_ERROR;
		GLuint* data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		data = static_cast<GLuint*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 512 * sizeof(GLuint), GL_MAP_READ_BIT | GL_MAP_WRITE_BIT));

		std::sort(data, data + 512);
		for (int i = 0; i < 512; i += 2)
		{
			if (data[i] != data[i + 1])
			{
				Output("Pair of values should be equal, got: %d, %d\n", data[i], data[i + 1]);
				error = ERROR;
			}
			if (i < 510 && data[i] == data[i + 2])
			{
				Output("Too many same values found: %d, index: %d\n", data[i], i);
				error = ERROR;
			}
		}

		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return error;
	}